

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dmemory.c
# Opt level: O3

int dLUWorkInit(int m,int n,int panel_size,int **iworkptr,double **dworkptr,GlobalLU_t *Glu)

{
  int_t *piVar1;
  int iVar2;
  int iVar3;
  long lVar4;
  int *piVar5;
  double *pdVar6;
  int iVar7;
  double *pdVar8;
  int iVar9;
  
  iVar2 = sp_ienv(3);
  iVar3 = sp_ienv(7);
  iVar2 = sp_ienv((uint)(iVar2 <= iVar3) * 4 + 3);
  iVar3 = sp_ienv(4);
  iVar9 = (panel_size * 2 + 5) * m * 4;
  iVar2 = (iVar3 + iVar2) * panel_size;
  if (iVar2 <= m) {
    iVar2 = m;
  }
  if (Glu->MemModel == SYSTEM) {
    piVar5 = int32Calloc(iVar9 >> 2);
  }
  else {
    iVar3 = (Glu->stack).used + iVar9;
    if ((Glu->stack).size <= iVar3) {
      *iworkptr = (int *)0x0;
      goto LAB_00107c0d;
    }
    lVar4 = (long)(Glu->stack).top2 - (long)iVar9;
    (Glu->stack).top2 = (int_t)lVar4;
    piVar5 = (int *)(lVar4 + (long)(Glu->stack).array);
    (Glu->stack).used = iVar3;
  }
  *iworkptr = piVar5;
  if (piVar5 != (int *)0x0) {
    iVar2 = (iVar2 + panel_size * m) * 8;
    if (Glu->MemModel == SYSTEM) {
      pdVar6 = (double *)superlu_malloc((long)iVar2);
      *dworkptr = pdVar6;
    }
    else {
      iVar3 = (Glu->stack).used;
      iVar7 = iVar3 + iVar2;
      if (iVar7 < (Glu->stack).size) {
        lVar4 = (long)(Glu->stack).top2 - (long)iVar2;
        (Glu->stack).top2 = (int_t)lVar4;
        pdVar6 = (double *)(lVar4 + (long)(Glu->stack).array);
        (Glu->stack).used = iVar7;
        iVar3 = iVar7;
      }
      else {
        pdVar6 = (double *)0x0;
      }
      *dworkptr = pdVar6;
      if (((ulong)pdVar6 & 7) != 0) {
        pdVar8 = (double *)(((long)pdVar6 + 7U & 0xfffffffffffffff8) - 8);
        *dworkptr = pdVar8;
        iVar2 = (int)pdVar6 - (int)pdVar8;
        piVar1 = &(Glu->stack).top2;
        *piVar1 = *piVar1 - iVar2;
        (Glu->stack).used = iVar3 + iVar2;
        return 0;
      }
    }
    if (pdVar6 != (double *)0x0) {
      return 0;
    }
    fwrite("malloc fails for local dworkptr[].",0x22,1,_stderr);
    return iVar9 + n + iVar2;
  }
LAB_00107c0d:
  fwrite("dLUWorkInit: malloc fails for local iworkptr[]\n",0x2f,1,_stderr);
  return iVar9 + n;
}

Assistant:

int
dLUWorkInit(int m, int n, int panel_size, int **iworkptr, 
            double **dworkptr, GlobalLU_t *Glu)
{
    int    isize, dsize, extra;
    double *old_ptr;
    int    maxsuper = SUPERLU_MAX( sp_ienv(3), sp_ienv(7) ),
           rowblk   = sp_ienv(4);

    /* xplore[m] and xprune[n] can be 64-bit; they are allocated separately */
    //isize = ( (2 * panel_size + 3 + NO_MARKER ) * m + n ) * sizeof(int);
    isize = ( (2 * panel_size + 2 + NO_MARKER ) * m ) * sizeof(int);
    dsize = (m * panel_size +
	     NUM_TEMPV(m,panel_size,maxsuper,rowblk)) * sizeof(double);
    
    if ( Glu->MemModel == SYSTEM ) 
	*iworkptr = (int *) int32Calloc(isize/sizeof(int));
    else
	*iworkptr = (int *) duser_malloc(isize, TAIL, Glu);
    if ( ! *iworkptr ) {
	fprintf(stderr, "dLUWorkInit: malloc fails for local iworkptr[]\n");
	return (isize + n);
    }

    if ( Glu->MemModel == SYSTEM )
	*dworkptr = (double *) SUPERLU_MALLOC(dsize);
    else {
	*dworkptr = (double *) duser_malloc(dsize, TAIL, Glu);
	if ( NotDoubleAlign(*dworkptr) ) {
	    old_ptr = *dworkptr;
	    *dworkptr = (double*) DoubleAlign(*dworkptr);
	    *dworkptr = (double*) ((double*)*dworkptr - 1);
	    extra = (char*)old_ptr - (char*)*dworkptr;
#if ( DEBUGlevel>=1 )
	    printf("dLUWorkInit: not aligned, extra %d\n", extra); fflush(stdout);
#endif	    
	    Glu->stack.top2 -= extra;
	    Glu->stack.used += extra;
	}
    }
    if ( ! *dworkptr ) {
	fprintf(stderr, "malloc fails for local dworkptr[].");
	return (isize + dsize + n);
    }
	
    return 0;
}